

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::InternalReserveSmallCapacityFromEmpty
          (ExtensionSet *this,size_t minimum_new_capacity)

{
  long lVar1;
  uint16_t powerof2_flat_capacity;
  KeyValue *pKVar2;
  byte bVar3;
  
  if (this->flat_capacity_ == 0) {
    if (minimum_new_capacity < 0x101) {
      if (minimum_new_capacity != 0) {
        lVar1 = 0x3f;
        if (minimum_new_capacity != 0) {
          for (; minimum_new_capacity >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        bVar3 = 0x40 - ((byte)lVar1 ^ 0x3f);
        if (minimum_new_capacity - 1 < (minimum_new_capacity ^ minimum_new_capacity - 1)) {
          bVar3 = (byte)lVar1;
        }
        powerof2_flat_capacity = (uint16_t)(1L << (bVar3 & 0x3f));
        this->flat_capacity_ = powerof2_flat_capacity;
        pKVar2 = AllocateFlatMap(this->arena_,powerof2_flat_capacity);
        (this->map_).flat = pKVar2;
        return;
      }
      goto LAB_0023cc3a;
    }
  }
  else {
    InternalReserveSmallCapacityFromEmpty((ExtensionSet *)&stack0xffffffffffffffe8);
  }
  InternalReserveSmallCapacityFromEmpty((ExtensionSet *)&stack0xffffffffffffffe8);
LAB_0023cc3a:
  InternalReserveSmallCapacityFromEmpty((ExtensionSet *)&stack0xffffffffffffffe8);
}

Assistant:

void ExtensionSet::InternalReserveSmallCapacityFromEmpty(
    size_t minimum_new_capacity) {
  ABSL_DCHECK(flat_capacity_ == 0);
  ABSL_DCHECK(minimum_new_capacity <= kMaximumFlatCapacity);
  ABSL_DCHECK(minimum_new_capacity > 0);
  const size_t new_flat_capacity = absl::bit_ceil(minimum_new_capacity);
  flat_capacity_ = new_flat_capacity;
  map_.flat = AllocateFlatMap(arena_, new_flat_capacity);
}